

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void CESkyCoord::ICRS2Galactic(CESkyCoord *in_icrs,CESkyCoord *out_galactic)

{
  double dVar1;
  CEAngle CVar2;
  double glat;
  double glon;
  double local_d0;
  double local_c8;
  CEAngle local_c0;
  double local_b0;
  CEAngle local_a8;
  CEDate local_98;
  CEDate local_58;
  
  local_c8 = 0.0;
  local_d0 = 0.0;
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*in_icrs->_vptr_CESkyCoord[3])(&local_c0,in_icrs,&local_58);
  local_b0 = CEAngle::Rad(&local_c0);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar1,JD);
  (*in_icrs->_vptr_CESkyCoord[4])(&local_a8,in_icrs,&local_98);
  dVar1 = CEAngle::Rad(&local_a8);
  iauIcrs2g(local_b0,SUB84(dVar1,0),&local_c8,&local_d0);
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  CEAngle::~CEAngle(&local_c0);
  CEDate::~CEDate(&local_58);
  CEAngle::Rad((CEAngle *)&local_58,&local_c8);
  CVar2 = CEAngle::Rad((CEAngle *)&local_98,&local_d0);
  local_c0._vptr_CEAngle._0_4_ = 2;
  (*out_galactic->_vptr_CESkyCoord[5])(CVar2.angle_,out_galactic,&local_58,&local_98);
  CEAngle::~CEAngle((CEAngle *)&local_98);
  CEAngle::~CEAngle((CEAngle *)&local_58);
  return;
}

Assistant:

void CESkyCoord::ICRS2Galactic(const CESkyCoord& in_icrs,
                               CESkyCoord*       out_galactic)
{
    // Use the sofa method to convert the coordinates
    double glon(0.0);
    double glat(0.0);
    iauIcrs2g(in_icrs.XCoord().Rad(), in_icrs.YCoord().Rad(), &glon, &glat);
    out_galactic->SetCoordinates(CEAngle::Rad(glon), 
                                 CEAngle::Rad(glat),
                                 CESkyCoordType::GALACTIC);

    return;
}